

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_37(QPDF *pdf,char *arg2)

{
  QPDFPageObjectHelper *page;
  ParserCallbacks *pPVar1;
  ParserCallbacks cb;
  ParserCallbacks *local_58;
  ParserCallbacks *local_50;
  undefined **local_40 [4];
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_40,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_40);
  for (pPVar1 = local_58; pPVar1 != local_50; pPVar1 = pPVar1 + 0x38) {
    local_40[0] = &PTR__ParserCallbacks_0014f718;
    QPDFPageObjectHelper::parseContents(pPVar1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_58);
  return;
}

Assistant:

static void
test_37(QPDF& pdf, char const* arg2)
{
    // Parse content streams of all pages
    for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        ParserCallbacks cb;
        page.parseContents(&cb);
    }
}